

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

uint32_t find_exact_color_in_palette
                   (ogt_vox_rgba *palette,uint32_t palette_count,ogt_vox_rgba color_to_find)

{
  ogt_vox_rgba oVar1;
  uint8_t uStack_23;
  uint8_t uStack_22;
  uint local_20;
  ogt_vox_rgba color_to_match;
  uint32_t color_index;
  uint32_t palette_count_local;
  ogt_vox_rgba *palette_local;
  ogt_vox_rgba color_to_find_local;
  
  local_20 = 1;
  do {
    if (palette_count <= local_20) {
      return 0xffffffff;
    }
    oVar1 = palette[local_20];
    if (((uint)oVar1 & 0xff) == ((uint)color_to_find & 0xff)) {
      uStack_23 = oVar1.g;
      palette_local._1_1_ = color_to_find.g;
      if (uStack_23 == palette_local._1_1_) {
        uStack_22 = oVar1.b;
        palette_local._2_1_ = color_to_find.b;
        if (uStack_22 == palette_local._2_1_) {
          return local_20;
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static uint32_t find_exact_color_in_palette(const ogt_vox_rgba * palette, uint32_t palette_count, const ogt_vox_rgba color_to_find) {
        for (uint32_t color_index = 1; color_index < palette_count; color_index++) {
            const ogt_vox_rgba color_to_match = palette[color_index];
            // we only try to match r,g,b components exactly.
            if (color_to_match.r == color_to_find.r && color_to_match.g == color_to_find.g && color_to_match.b == color_to_find.b)
                return color_index;
        }
        // no exact color found
        return UINT32_MAX;
    }